

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O0

exr_result_t compress_b44_impl(exr_encode_pipeline_t *encode,int flat_field)

{
  int iVar1;
  int iVar2;
  exr_result_t eVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  int in_ESI;
  long *in_RDI;
  int j;
  int i;
  int n;
  uint16_t s [16];
  int x;
  uint16_t *row3;
  uint16_t *row2;
  uint16_t *row1;
  uint16_t *row0;
  int y_1;
  exr_coding_channel_info_t *curc_1;
  int c_1;
  exr_coding_channel_info_t *curc;
  int c;
  int cury;
  int y;
  exr_result_t rv;
  uint64_t nBytes;
  uint64_t bpl;
  int wcount;
  int ny;
  int nx;
  uint8_t *packed;
  uint8_t *tmp;
  uint8_t *scratch;
  uint64_t nOut;
  uint8_t *out;
  int local_e4;
  int local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar12;
  size_t *in_stack_ffffffffffffff50;
  undefined8 *puVar13;
  void **in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  exr_encode_pipeline_t *in_stack_ffffffffffffff68;
  int local_8c;
  int local_7c;
  int local_70;
  int local_68;
  void *local_40;
  void *local_38;
  void *local_30;
  long local_28;
  void *local_20;
  int in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_20 = (void *)in_RDI[0x14];
  eVar3 = internal_encode_alloc_buffer
                    (in_stack_ffffffffffffff68,
                     (exr_transcoding_pipeline_buffer_id_t)
                     ((ulong)in_stack_ffffffffffffff60 >> 0x20),in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff50,
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (eVar3 == 0) {
    local_40 = (void *)in_RDI[0xc];
    for (local_68 = 0; local_68 < *(int *)((long)in_RDI + 0x24); local_68 = local_68 + 1) {
      lVar8 = in_RDI[4];
      local_30 = (void *)in_RDI[0x17];
      for (local_70 = 0; local_70 < (short)in_RDI[1]; local_70 = local_70 + 1) {
        lVar5 = *in_RDI + (long)local_70 * 0x30;
        iVar1 = *(int *)(lVar5 + 0xc);
        sVar6 = (long)iVar1 * (long)*(char *)(lVar5 + 0x19);
        lVar7 = (long)*(int *)(lVar5 + 8) * sVar6;
        if (lVar7 != 0) {
          iVar2 = local_68;
          if (1 < *(int *)(lVar5 + 0x14)) {
            if ((local_68 + (int)lVar8) % *(int *)(lVar5 + 0x14) != 0) {
              local_30 = (void *)(lVar7 + (long)local_30);
              goto LAB_00107aa1;
            }
            iVar2 = local_68 / *(int *)(lVar5 + 0x14);
          }
          local_38 = (void *)((long)iVar2 * sVar6 + (long)local_30);
          memcpy(local_38,local_40,sVar6);
          if (*(short *)(lVar5 + 0x1a) == 1) {
            priv_to_native16(local_38,iVar1);
          }
          local_40 = (void *)(sVar6 + (long)local_40);
          local_30 = (void *)(lVar7 + (long)local_30);
        }
LAB_00107aa1:
      }
    }
    local_28 = 0;
    local_30 = (void *)in_RDI[0x17];
    for (local_7c = 0; local_7c < (short)in_RDI[1]; local_7c = local_7c + 1) {
      lVar8 = *in_RDI + (long)local_7c * 0x30;
      iVar1 = *(int *)(lVar8 + 0xc);
      iVar2 = *(int *)(lVar8 + 8);
      sVar6 = (long)iVar2 * (long)iVar1 * (long)*(char *)(lVar8 + 0x19);
      if (sVar6 != 0) {
        if (*(short *)(lVar8 + 0x1a) == 1) {
          for (local_8c = 0; local_8c < iVar2; local_8c = local_8c + 4) {
            puVar9 = (undefined8 *)((long)local_30 + (long)(local_8c * iVar1) * 2);
            puVar10 = (undefined8 *)((long)puVar9 + (long)iVar1 * 2);
            puVar11 = (undefined8 *)((long)puVar10 + (long)iVar1 * 2);
            puVar13 = (undefined8 *)((long)puVar11 + (long)iVar1 * 2);
            if (iVar2 <= local_8c + 3) {
              if (iVar2 <= local_8c + 1) {
                puVar10 = puVar9;
              }
              puVar13 = puVar11;
              if (iVar2 <= local_8c + 2) {
                puVar13 = puVar10;
                puVar11 = puVar10;
              }
            }
            for (iVar12 = 0; iVar12 < iVar1; iVar12 = iVar12 + 4) {
              if (iVar12 + 3 < iVar1) {
                local_d8 = *puVar9;
                local_d0 = *puVar10;
                local_c8 = *puVar11;
                local_c0 = *puVar13;
              }
              else {
                iVar4 = iVar1 - iVar12;
                for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
                  local_e4 = local_e0;
                  if (iVar4 + -1 < local_e0) {
                    local_e4 = iVar4 + -1;
                  }
                  *(undefined2 *)((long)&local_d8 + (long)local_e0 * 2) =
                       *(undefined2 *)((long)puVar9 + (long)local_e4 * 2);
                  *(undefined2 *)((long)&local_d8 + (long)(local_e0 + 4) * 2) =
                       *(undefined2 *)((long)puVar10 + (long)local_e4 * 2);
                  *(undefined2 *)((long)&local_d8 + (long)(local_e0 + 8) * 2) =
                       *(undefined2 *)((long)puVar11 + (long)local_e4 * 2);
                  *(undefined2 *)((long)&local_d8 + (long)(local_e0 + 0xc) * 2) =
                       *(undefined2 *)((long)puVar13 + (long)local_e4 * 2);
                }
              }
              puVar9 = puVar9 + 1;
              puVar10 = puVar10 + 1;
              puVar11 = puVar11 + 1;
              puVar13 = puVar13 + 1;
              if (*(char *)(lVar8 + 0x18) != '\0') {
                convertFromLinear((uint16_t *)&local_d8);
              }
              iVar4 = pack((uint16_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                           ,(uint8_t *)in_RDI,in_ESI,in_stack_ffffffffffffffe8);
              local_20 = (void *)((long)local_20 + (long)iVar4);
              local_28 = iVar4 + local_28;
              if ((ulong)in_RDI[0x16] < local_28 + 0xeU) {
                return 1;
              }
            }
          }
          local_30 = (void *)(sVar6 + (long)local_30);
        }
        else {
          if ((ulong)in_RDI[0x16] < local_28 + sVar6) {
            return 1;
          }
          memcpy(local_20,local_30,sVar6);
          local_20 = (void *)(sVar6 + (long)local_20);
          local_30 = (void *)(sVar6 + (long)local_30);
          local_28 = sVar6 + local_28;
        }
      }
    }
    in_RDI[0x15] = local_28;
  }
  return eVar3;
}

Assistant:

static exr_result_t
compress_b44_impl (exr_encode_pipeline_t* encode, int flat_field)
{
    uint8_t*       out  = (uint8_t*) encode->compressed_buffer;
    uint64_t       nOut = 0;
    uint8_t *      scratch, *tmp;
    const uint8_t* packed;
    int            nx, ny, wcount;
    uint64_t       bpl, nBytes;
    exr_result_t   rv;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        encode->packed_bytes);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nOut   = 0;
    packed = (const uint8_t*) encode->packed_buffer;
    for (int y = 0; y < encode->chunk.height; ++y)
    {
        int cury = y + encode->chunk.start_y;

        scratch = (uint8_t*) encode->scratch_buffer_1;
        for (int c = 0; c < encode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = encode->channels + c;

            nx     = curc->width;
            ny     = curc->height;
            bpl    = ((uint64_t) (nx)) * (uint64_t) (curc->bytes_per_element);
            nBytes = ((uint64_t) (ny)) * bpl;

            if (nBytes == 0) continue;

            tmp = scratch;
            if (curc->y_samples > 1)
            {
                if ((cury % curc->y_samples) != 0)
                {
                    scratch += nBytes;
                    continue;
                }
                tmp += ((uint64_t) (y / curc->y_samples)) * bpl;
            }
            else { tmp += ((uint64_t) y) * bpl; }

            memcpy (tmp, packed, bpl);
            if (curc->data_type == EXR_PIXEL_HALF) priv_to_native16 (tmp, nx);
            packed += bpl;
            scratch += nBytes;
        }
    }

    nOut    = 0;
    scratch = (uint8_t*) encode->scratch_buffer_1;
    for (int c = 0; c < encode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* curc = encode->channels + c;

        nx     = curc->width;
        ny     = curc->height;
        bpl    = (uint64_t) (nx) * (uint64_t) (curc->bytes_per_element);
        nBytes = ((uint64_t) (ny)) * bpl;

        if (nBytes == 0) continue;

        if (curc->data_type != EXR_PIXEL_HALF)
        {
            if (nOut + nBytes > encode->compressed_alloc_size)
                return EXR_ERR_OUT_OF_MEMORY;
            memcpy (out, scratch, nBytes);
            out += nBytes;
            scratch += nBytes;
            nOut += nBytes;
            continue;
        }

        for (int y = 0; y < ny; y += 4)
        {
            //
            // Copy the next 4x4 pixel block into array s.
            // If the width, cd.nx, or the height, cd.ny, of
            // the pixel data in _tmpBuffer is not divisible
            // by 4, then pad the data by repeating the
            // rightmost column and the bottom row.
            //

            uint16_t* row0 = (uint16_t*) scratch;
            row0 += y * nx;
            uint16_t* row1 = row0 + nx;
            uint16_t* row2 = row1 + nx;
            uint16_t* row3 = row2 + nx;

            if (y + 3 >= ny)
            {
                if (y + 1 >= ny) row1 = row0;
                if (y + 2 >= ny) row2 = row1;

                row3 = row2;
            }

            for (int x = 0; x < nx; x += 4)
            {
                uint16_t s[16];

                if (x + 3 >= nx)
                {
                    int n = nx - x;

                    for (int i = 0; i < 4; ++i)
                    {
                        int j = i;
                        if (j > n - 1) j = n - 1;

                        s[i + 0]  = row0[j];
                        s[i + 4]  = row1[j];
                        s[i + 8]  = row2[j];
                        s[i + 12] = row3[j];
                    }
                }
                else
                {
                    memcpy (&s[0], row0, 4 * sizeof (uint16_t));
                    memcpy (&s[4], row1, 4 * sizeof (uint16_t));
                    memcpy (&s[8], row2, 4 * sizeof (uint16_t));
                    memcpy (&s[12], row3, 4 * sizeof (uint16_t));
                }

                row0 += 4;
                row1 += 4;
                row2 += 4;
                row3 += 4;

                //
                // Compress the contents of array s and append the
                // results to the output buffer.
                //

                if (curc->p_linear) convertFromLinear (s);

                wcount = pack (s, out, flat_field, !(curc->p_linear));
                out += wcount;
                nOut += (uint64_t) wcount;
                if (nOut + 14 > encode->compressed_alloc_size)
                    return EXR_ERR_OUT_OF_MEMORY;
            }
        }
        scratch += nBytes;
    }

    encode->compressed_bytes = nOut;
    return rv;
}